

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::escape(string *out,string *str)

{
  uint8_t n;
  bool bVar1;
  uint8_t *puVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_30;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *str_local;
  string *out_local;
  
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_30._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0), bVar1) {
    puVar2 = (uint8_t *)
             __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    n = *puVar2;
    if (n == '\a') {
      std::__cxx11::string::operator+=((string *)out,"\\a");
    }
    else if (n == '\b') {
      std::__cxx11::string::operator+=((string *)out,"\\b");
    }
    else if (n == '\f') {
      std::__cxx11::string::operator+=((string *)out,"\\f");
    }
    else if (n == '\n') {
      std::__cxx11::string::operator+=((string *)out,"\\n");
    }
    else if (n == '\r') {
      std::__cxx11::string::operator+=((string *)out,"\\r");
    }
    else if (n == '\t') {
      std::__cxx11::string::operator+=((string *)out,"\\t");
    }
    else if (n == '\v') {
      std::__cxx11::string::operator+=((string *)out,"\\v");
    }
    else if (n == '\\') {
      std::__cxx11::string::operator+=((string *)out,"\\\\");
    }
    else if (n == '\'') {
      std::__cxx11::string::operator+=((string *)out,"\\\'");
    }
    else if (n == '\"') {
      std::__cxx11::string::operator+=((string *)out,"\\\"");
    }
    else if (n == ' ') {
      std::__cxx11::string::operator+=((string *)out,"\\ ");
    }
    else if (((char)n < '\0') || ('\x1f' < (char)n)) {
      std::__cxx11::string::operator+=((string *)out,n);
    }
    else {
      std::__cxx11::string::operator+=((string *)out,"\\x");
      write_hex_byte(out,n);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

static void escape(std::string& out, const std::string& str)
	{
		for (char c : str) {
			/**/ if (c == '\a') { out += "\\a";  }
			else if (c == '\b') { out += "\\b";  }
			else if (c == '\f') { out += "\\f";  }
			else if (c == '\n') { out += "\\n";  }
			else if (c == '\r') { out += "\\r";  }
			else if (c == '\t') { out += "\\t";  }
			else if (c == '\v') { out += "\\v";  }
			else if (c == '\\') { out += "\\\\"; }
			else if (c == '\'') { out += "\\\'"; }
			else if (c == '\"') { out += "\\\""; }
			else if (c == ' ')  { out += "\\ ";  }
			else if (0 <= c && c < 0x20) { // ASCI control character:
			// else if (c < 0x20 || c != (c & 127)) { // ASCII control character or UTF-8:
				out += "\\x";
				write_hex_byte(out, static_cast<uint8_t>(c));
			} else { out += c; }
		}
	}